

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::HostWrite<int>::HostWrite(HostWrite<int> *this,Write<int> *write_in)

{
  Write<int> *write_in_local;
  HostWrite<int> *this_local;
  
  Write<int>::Write(&this->write_,write_in);
  return;
}

Assistant:

HostWrite<T>::HostWrite(Write<T> write_in)
    : write_(write_in)
#ifdef OMEGA_H_USE_KOKKOS
      ,
      mirror_(create_uninit_mirror_view(write_.view()))
#endif
{
#ifdef OMEGA_H_USE_KOKKOS
  Kokkos::deep_copy(mirror_, write_.view());
#elif defined(OMEGA_H_USE_CUDA)
  mirror_.reset(new T[std::size_t(write_.size())]);
  auto const err = cudaMemcpy(mirror_.get(), write_.data(),
      std::size_t(write_.size()) * sizeof(T), cudaMemcpyDeviceToHost);
  OMEGA_H_CHECK(err == cudaSuccess);
#endif
}